

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O0

EC_KEY * d2i_ECParameters(EC_KEY **key,uchar **in,long len)

{
  int iVar1;
  EC_GROUP *group_00;
  EC_KEY *key_00;
  uint8_t *puVar2;
  EC_KEY *ret;
  EC_GROUP *group;
  CBS cbs;
  long len_local;
  uint8_t **inp_local;
  EC_KEY **out_key_local;
  
  if (-1 < len) {
    cbs.len = len;
    CBS_init((CBS *)&group,*in,len);
    group_00 = EC_KEY_parse_parameters((CBS *)&group);
    if (group_00 != (EC_GROUP *)0x0) {
      key_00 = EC_KEY_new();
      if ((key_00 != (EC_KEY *)0x0) &&
         (iVar1 = EC_KEY_set_group(key_00,(EC_GROUP *)group_00), iVar1 != 0)) {
        if (key != (EC_KEY **)0x0) {
          EC_KEY_free(*key);
          *key = key_00;
        }
        puVar2 = CBS_data((CBS *)&group);
        *in = puVar2;
        return key_00;
      }
      EC_KEY_free(key_00);
    }
  }
  return (EC_KEY *)0x0;
}

Assistant:

EC_KEY *d2i_ECParameters(EC_KEY **out_key, const uint8_t **inp, long len) {
  if (len < 0) {
    return NULL;
  }

  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  const EC_GROUP *group = EC_KEY_parse_parameters(&cbs);
  if (group == NULL) {
    return NULL;
  }

  EC_KEY *ret = EC_KEY_new();
  if (ret == NULL || !EC_KEY_set_group(ret, group)) {
    EC_KEY_free(ret);
    return NULL;
  }

  if (out_key != NULL) {
    EC_KEY_free(*out_key);
    *out_key = ret;
  }
  *inp = CBS_data(&cbs);
  return ret;
}